

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O1

LayoutNode * __thiscall
rengine::AllocationPool<rengine::LayoutNode>::allocate(AllocationPool<rengine::LayoutNode> *this)

{
  Node **ppNVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  LayoutNode *pLVar5;
  uint *puVar6;
  
  uVar3 = this->m_nextFree;
  if (this->m_poolSize <= uVar3) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,
                  "T *rengine::AllocationPool<rengine::LayoutNode>::allocate() [T = rengine::LayoutNode]"
                 );
  }
  pLVar5 = this->m_memory;
  if (pLVar5 == (LayoutNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,
                  "T *rengine::AllocationPool<rengine::LayoutNode>::allocate() [T = rengine::LayoutNode]"
                 );
  }
  puVar6 = this->m_free;
  if (puVar6 == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,
                  "T *rengine::AllocationPool<rengine::LayoutNode>::allocate() [T = rengine::LayoutNode]"
                 );
  }
  if (puVar6[uVar3] < this->m_poolSize) {
    this->m_nextFree = uVar3 + 1;
    uVar3 = puVar6[uVar3];
    pLVar5[uVar3].super_Node.super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    ppNVar1 = &pLVar5[uVar3].super_Node.m_parent;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    ppNVar1 = &pLVar5[uVar3].super_Node.m_next;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    uVar4 = *(uint *)&pLVar5[uVar3].super_Node.field_0x30;
    pLVar5[uVar3].super_Node.super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Node_00174b80;
    puVar2 = &pLVar5[uVar3].super_Node.field_0x34;
    *(undefined8 *)puVar2 = 0;
    *(undefined8 *)(puVar2 + 8) = 0;
    *(undefined8 *)&pLVar5[uVar3].field_0x44 = 0;
    *(undefined8 *)(&pLVar5[uVar3].field_0x44 + 8) = 0;
    *(undefined8 *)&pLVar5[uVar3].field_0x54 = 0;
    pLVar5[uVar3].field_0x5c = pLVar5[uVar3].field_0x5c & 0xf8;
    *(uint *)&pLVar5[uVar3].super_Node.field_0x30 = uVar4 & 0xfffff800 | 0x100;
    return pLVar5 + uVar3;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,
                "T *rengine::AllocationPool<rengine::LayoutNode>::allocate() [T = rengine::LayoutNode]"
               );
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }